

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Int cell_dim)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  int iVar4;
  Alloc *pAVar5;
  Alloc *pAVar6;
  Alloc *pAVar7;
  undefined8 uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  Alloc *this_00;
  Alloc *this_01;
  long lVar10;
  char cVar11;
  int iVar12;
  void *extraout_RDX;
  uint uVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  Alloc *pAVar20;
  long lVar21;
  Alloc *this_02;
  int iVar22;
  size_t sVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  Read<signed_char> RVar29;
  Write<signed_char> cand_codes_w;
  IntIterator last;
  Read<signed_char> s2dim;
  Read<signed_char> c2dim;
  LOs cs2s;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  type f;
  Adj e2c;
  Write<signed_char> local_2f8;
  ulong local_2e0;
  element_type *local_2d8;
  Alloc *local_2d0;
  Alloc *local_2c8;
  Write<signed_char> local_2c0;
  undefined1 local_2b0 [32];
  Alloc *local_290;
  element_type *local_288;
  Alloc *local_280;
  element_type *local_278;
  Alloc *local_270;
  element_type *local_268;
  Alloc *local_260;
  element_type *local_258;
  Int local_250;
  Alloc *local_248;
  element_type *local_240;
  int local_238;
  Alloc *local_230;
  element_type *local_228;
  Alloc *local_220;
  element_type *local_218;
  Alloc *local_210;
  element_type *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  Alloc *local_1d8;
  element_type *local_1d0;
  Alloc *local_1c8;
  element_type *local_1c0;
  Alloc *local_1b8;
  element_type *local_1b0;
  Alloc *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  Alloc *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  Alloc *local_188;
  element_type *peStack_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  element_type *peStack_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  element_type *peStack_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  element_type *peStack_150;
  Int local_148;
  Alloc *local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_138;
  int local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  element_type *peStack_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  element_type *peStack_110;
  Alloc *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  Alloc *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  Alloc *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  Alloc *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  Alloc *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  Alloc *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  Int local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  element_type *local_90;
  int local_88;
  Alloc *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Alloc *local_70;
  element_type *local_68;
  Adj local_60;
  
  Mesh::ask_up(&local_60,mesh,1,cell_dim);
  local_1b8 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar6 = local_1b8;
  local_1b0 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_1c8 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar7 = local_1c8;
  local_1c0 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_1d8 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_01 = local_1d8;
  local_1d0 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  local_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  Mesh::ask_down((Adj *)local_2b0,mesh,cell_dim,cell_dim - 1U);
  uVar8 = local_2b0._24_8_;
  local_1e8 = (Alloc *)local_2b0._16_8_;
  local_1e0 = (element_type *)local_2b0._24_8_;
  if (((local_2b0._16_8_ & 7) == 0 && (Alloc *)local_2b0._16_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_2b0._16_8_ + 0x30) = *(int *)(local_2b0._16_8_ + 0x30) + -1;
    local_1e8 = (Alloc *)(*(long *)local_2b0._16_8_ * 8 + 1);
  }
  this_00 = local_1e8;
  local_2b0._16_8_ = (Alloc *)0x0;
  local_2b0._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d0 = pAVar7;
  local_2c8 = pAVar6;
  Adj::~Adj((Adj *)local_2b0);
  iVar24 = -1;
  if ((uint)cell_dim < 4) {
    iVar24 = cell_dim + 1;
  }
  local_2b0._0_8_ = (Alloc *)(local_2b0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_200,(Int)mesh,(string *)(ulong)(uint)cell_dim);
  pAVar7 = local_2c8;
  pAVar6 = local_2d0;
  if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_210,(Int)mesh,(string *)(ulong)(cell_dim - 1U));
  if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  pAVar20 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar20 & 1) == 0) {
    sVar23 = pAVar20->size;
  }
  else {
    sVar23 = (ulong)pAVar20 >> 3;
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  local_2e0 = sVar23 >> 2;
  Write<signed_char>::Write(&local_2f8,(LO)local_2e0,(string *)local_2b0);
  if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  local_100 = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100 = (Alloc *)(local_100->size * 8 + 1);
    }
    else {
      local_100->use_count = local_100->use_count + 1;
    }
  }
  local_f8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(cand_codes->write_).shared_alloc_.direct_ptr
  ;
  local_f0 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0 = (Alloc *)(local_f0->size * 8 + 1);
    }
    else {
      local_f0->use_count = local_f0->use_count + 1;
    }
  }
  local_e8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (cands2edges->write_).shared_alloc_.direct_ptr;
  local_e0 = pAVar7;
  bVar25 = ((ulong)pAVar7 & 7) == 0;
  if (bVar25 && pAVar7 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)(pAVar7->size * 8 + 1);
    }
    else {
      pAVar7->use_count = pAVar7->use_count + 1;
    }
  }
  local_d8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_d0 = pAVar6;
  bVar26 = ((ulong)pAVar6 & 7) == 0;
  if (bVar26 && pAVar6 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)(pAVar6->size * 8 + 1);
    }
    else {
      pAVar6->use_count = pAVar6->use_count + 1;
    }
  }
  local_c8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_c0 = this_01;
  bVar27 = ((ulong)this_01 & 7) == 0;
  if (bVar27 && this_01 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_b8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.codes.write_.shared_alloc_.direct_ptr;
  local_b0 = (Alloc *)local_200._M_pi;
  if (((ulong)local_200._M_pi & 7) == 0 && (Alloc *)local_200._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)((long)(local_200._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_200._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_200._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  bVar28 = ((ulong)this_00 & 7) == 0;
  if (bVar28 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_90 = (element_type *)uVar8;
  local_80 = local_210;
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_210->size * 8 + 1);
    }
    else {
      local_210->use_count = local_210->use_count + 1;
    }
  }
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208;
  local_70 = local_2f8.shared_alloc_.alloc;
  if (((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
      local_2f8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)((local_2f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2f8.shared_alloc_.alloc)->use_count = (local_2f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2d8 = (element_type *)local_2f8.shared_alloc_.direct_ptr;
  local_68 = (element_type *)local_2f8.shared_alloc_.direct_ptr;
  local_1a8 = local_100;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_100->size * 8 + 1);
    }
    else {
      local_100->use_count = local_100->use_count + 1;
    }
  }
  local_198 = local_f0;
  if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_f0->size * 8 + 1);
    }
    else {
      local_f0->use_count = local_f0->use_count + 1;
    }
  }
  local_188 = local_e0;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_e0->size * 8 + 1);
    }
    else {
      local_e0->use_count = local_e0->use_count + 1;
    }
  }
  peStack_180 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0;
  if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0->size * 8 + 1);
    }
    else {
      local_d0->use_count = local_d0->use_count + 1;
    }
  }
  peStack_170 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  peStack_160 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  peStack_150 = local_1f8;
  local_140 = (Alloc *)local_98._M_pi;
  if (((ulong)local_98._M_pi & 7) == 0 && (Alloc *)local_98._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140 = (Alloc *)((long)(local_98._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_98._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_98._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  _Stack_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  local_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  peStack_120 = local_208;
  local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  peStack_110 = (element_type *)local_2f8.shared_alloc_.direct_ptr;
  pAVar20 = pAVar7;
  this_02 = pAVar6;
  p_Stack_1a0 = local_f8._M_pi;
  p_Stack_190 = local_e8._M_pi;
  local_148 = cell_dim;
  local_130 = iVar24;
  local_a0 = cell_dim;
  local_88 = iVar24;
  if (0 < (int)local_2e0) {
    local_2b0._0_8_ = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      local_1a8->use_count = local_1a8->use_count + -1;
      local_2b0._0_8_ = local_1a8->size * 8 + 1;
    }
    local_1a8 = (Alloc *)0x0;
    p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2b0._16_8_ = local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      local_198->use_count = local_198->use_count + -1;
      local_2b0._16_8_ = local_198->size * 8 + 1;
    }
    local_198 = (Alloc *)0x0;
    p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_290 = local_188;
    local_288 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
      local_188->use_count = local_188->use_count + -1;
      local_290 = (Alloc *)(local_188->size * 8 + 1);
    }
    local_188 = (Alloc *)0x0;
    peStack_180 = (element_type *)0x0;
    local_280 = (Alloc *)local_178._M_pi;
    local_278 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_178._M_pi & 7) == 0 && (Alloc *)local_178._M_pi != (Alloc *)0x0) {
      *(int *)&local_178._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_178._M_pi[3]._vptr__Sp_counted_base + -1;
      local_280 = (Alloc *)((long)(local_178._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_170 = (element_type *)0x0;
    local_268 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
    local_270 = (Alloc *)local_168._M_pi;
    if (((ulong)local_168._M_pi & 7) == 0 && (Alloc *)local_168._M_pi != (Alloc *)0x0) {
      *(int *)&local_168._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_168._M_pi[3]._vptr__Sp_counted_base + -1;
      local_270 = (Alloc *)((long)(local_168._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_160 = (element_type *)0x0;
    local_258 = local_1f8;
    local_260 = (Alloc *)local_158._M_pi;
    if (((ulong)local_158._M_pi & 7) == 0 && (Alloc *)local_158._M_pi != (Alloc *)0x0) {
      *(int *)&local_158._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_158._M_pi[3]._vptr__Sp_counted_base + -1;
      local_260 = (Alloc *)((long)(local_158._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_150 = (element_type *)0x0;
    local_248 = local_140;
    local_240 = (element_type *)uVar8;
    if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
      local_140->use_count = local_140->use_count + -1;
      local_248 = (Alloc *)(local_140->size * 8 + 1);
    }
    local_140 = (Alloc *)0x0;
    _Stack_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228 = local_208;
    local_230 = (Alloc *)local_128._M_pi;
    if (((ulong)local_128._M_pi & 7) == 0 && (Alloc *)local_128._M_pi != (Alloc *)0x0) {
      *(int *)&local_128._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_128._M_pi[3]._vptr__Sp_counted_base + -1;
      local_230 = (Alloc *)((long)(local_128._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_120 = (element_type *)0x0;
    local_218 = (element_type *)local_2f8.shared_alloc_.direct_ptr;
    local_220 = (Alloc *)local_118._M_pi;
    if (((ulong)local_118._M_pi & 7) == 0 && (Alloc *)local_118._M_pi != (Alloc *)0x0) {
      *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base + -1;
      local_220 = (Alloc *)((long)(local_118._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_110 = (element_type *)0x0;
    entering_parallel = '\0';
    lVar21 = 0;
    do {
      bVar15 = *(byte *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *
                                 )&(local_f8._M_pi)->_vptr__Sp_counted_base)->_M_ptr + lVar21);
      lVar10 = (long)*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                       *)&(local_e8._M_pi)->_vptr__Sp_counted_base)->_M_ptr +
                             lVar21 * 4);
      iVar18 = *(int *)((long)&(((Graph *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                               ->a2ab).write_.shared_alloc_.alloc + lVar10 * 4);
      lVar14 = (long)iVar18;
      iVar4 = *(int *)((long)&(((Graph *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                              ->a2ab).write_.shared_alloc_.alloc + lVar10 * 4 + 4);
      if (iVar18 < iVar4) {
        do {
          iVar18 = *(int *)((long)&(((Graph *)
                                    local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr)->a2ab
                                   ).write_.shared_alloc_.alloc + lVar14 * 4);
          bVar16 = *(byte *)((long)&(((Graph *)local_60.codes.write_.shared_alloc_.direct_ptr)->a2ab
                                    ).write_.shared_alloc_.alloc + lVar14);
          cVar11 = (char)bVar16 >> 3;
          bVar16 = bVar16 >> 1;
          bVar17 = bVar16 & 3;
          cVar3 = *(char *)((long)&local_1f8->library_ + (long)iVar18);
          iVar18 = iVar18 * iVar24;
          if ((bVar15 & 1) == 0) goto LAB_00245b75;
          if (cell_dim == 1) {
            uVar19 = 2;
            goto switchD_00245a85_default;
          }
          uVar19 = 0xffffffff;
          if (cell_dim == 2) {
            if (cVar11 == '\x02') {
              uVar19 = -(uint)((bVar16 & 3) != 0) | 1;
              if (bVar17 == 1) {
                uVar19 = 0;
              }
            }
            else {
              if (cVar11 == '\x01') goto switchD_00245a85_caseD_3;
              if (cVar11 == '\0') goto switchD_00245a85_caseD_2;
            }
            goto switchD_00245a85_default;
          }
          if (cell_dim != 3) goto switchD_00245a85_default;
          switch(cVar11) {
          case '\0':
            uVar19 = -(uint)((bVar16 & 3) != 0) | 3;
            break;
          case '\x01':
            uVar19 = -(uint)((bVar16 & 3) != 0) | 1;
            goto LAB_00245b2e;
          case '\x02':
switchD_00245a85_caseD_2:
            uVar19 = -(uint)((bVar16 & 3) != 0) | 2;
            goto LAB_00245b47;
          case '\x03':
switchD_00245a85_caseD_3:
            uVar19 = -(uint)((bVar16 & 3) != 0);
            break;
          case '\x04':
            uVar19 = -(uint)((bVar16 & 3) != 0);
LAB_00245b2e:
            uVar13 = 3;
            goto LAB_00245b50;
          case '\x05':
            uVar19 = -(uint)((bVar16 & 3) != 0);
LAB_00245b47:
            uVar13 = 1;
            goto LAB_00245b50;
          default:
            goto switchD_00245a85_default;
          }
          uVar13 = 2;
LAB_00245b50:
          if (bVar17 == 1) {
            uVar19 = uVar13;
          }
switchD_00245a85_default:
          if (*(char *)((long)&(((Graph *)&local_208->library_)->a2ab).write_.shared_alloc_.alloc +
                       (long)*(int *)(uVar8 + (long)(int)(uVar19 + iVar18) * 4)) != cVar3) {
            bVar15 = bVar15 & 0xfe;
          }
LAB_00245b75:
          bVar16 = bVar15;
          if ((bVar15 & 2) == 0) goto LAB_00245c9a;
          iVar22 = -1;
          if (cell_dim != 3) {
            if (cell_dim == 2) {
              if (cVar11 == '\0') goto switchD_00245bf4_caseD_2;
              if (cVar11 == '\x01') goto switchD_00245bf4_caseD_3;
              if (cVar11 == '\x02') {
                iVar22 = (uint)(bVar17 == 1) * 2 + -1;
                if (bVar17 == 0) {
                  iVar22 = 0;
                }
              }
            }
            else if (cell_dim == 1) {
              iVar22 = 2;
            }
            goto switchD_00245bf4_default;
          }
          switch(cVar11) {
          case '\0':
            iVar22 = (uint)(bVar17 == 1) * 4 + -1;
            break;
          case '\x01':
            iVar22 = (uint)(bVar17 == 1) * 2 + -1;
            goto LAB_00245c54;
          case '\x02':
switchD_00245bf4_caseD_2:
            iVar22 = (uint)(bVar17 == 1) * 3 + -1;
            goto LAB_00245c6c;
          case '\x03':
switchD_00245bf4_caseD_3:
            iVar22 = -(uint)(bVar17 != 1);
            break;
          case '\x04':
            iVar22 = -(uint)(bVar17 != 1);
LAB_00245c54:
            iVar12 = 3;
            goto LAB_00245c74;
          case '\x05':
            iVar22 = -(uint)(bVar17 != 1);
LAB_00245c6c:
            iVar12 = 1;
            goto LAB_00245c74;
          default:
            goto switchD_00245bf4_default;
          }
          iVar12 = 2;
LAB_00245c74:
          if (bVar17 == 0) {
            iVar22 = iVar12;
          }
switchD_00245bf4_default:
          bVar16 = bVar15 & 0xfd;
          if (*(char *)((long)&(((Graph *)&local_208->library_)->a2ab).write_.shared_alloc_.alloc +
                       (long)*(int *)(uVar8 + (long)(iVar22 + iVar18) * 4)) == cVar3) {
            bVar16 = bVar15;
          }
LAB_00245c9a:
          bVar15 = bVar16;
          lVar14 = lVar14 + 1;
        } while (iVar4 != lVar14);
      }
      *(byte *)((long)&(((Graph *)local_2f8.shared_alloc_.direct_ptr)->a2ab).write_.shared_alloc_.
                       alloc + lVar21) = bVar15;
      lVar21 = lVar21 + 1;
    } while ((int)lVar21 != (int)local_2e0);
    local_2b0._8_8_ = local_f8._M_pi;
    local_2b0._24_8_ = local_e8._M_pi;
    local_250 = cell_dim;
    local_238 = iVar24;
    check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
    ~__0((__0 *)local_2b0);
    pAVar20 = local_2c8;
    this_02 = local_2d0;
  }
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)&local_1a8);
  _Var9._M_pi = local_1f0._M_pi;
  local_2c0.shared_alloc_.alloc = local_2f8.shared_alloc_.alloc;
  local_2c0.shared_alloc_.direct_ptr = local_2f8.shared_alloc_.direct_ptr;
  if ((((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
       local_2f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_2f8.shared_alloc_.alloc)->use_count = (local_2f8.shared_alloc_.alloc)->use_count + -1;
    local_2c0.shared_alloc_.alloc = (Alloc *)((local_2f8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_2f8.shared_alloc_.alloc = (Alloc *)0x0;
  local_2f8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_1f0._M_pi,&local_2c0);
  pAVar5 = local_2c0.shared_alloc_.alloc;
  if (((ulong)local_2c0.shared_alloc_.alloc & 7) == 0 &&
      local_2c0.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2c0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2c0.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)&local_100);
  pAVar5 = local_2f8.shared_alloc_.alloc;
  if (((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
      local_2f8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2f8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2f8.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    piVar1 = &local_210->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_210);
      operator_delete(local_210,0x48);
    }
  }
  if (((ulong)local_200._M_pi & 7) == 0 && (Alloc *)local_200._M_pi != (Alloc *)0x0) {
    p_Var2 = local_200._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_200._M_pi);
      operator_delete(local_200._M_pi,0x48);
    }
  }
  if (bVar28 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if (bVar27 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
    }
  }
  if (bVar26 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &this_02->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_02);
      operator_delete(this_02,0x48);
    }
  }
  if (bVar25 && pAVar7 != (Alloc *)0x0) {
    piVar1 = &pAVar20->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar20);
      operator_delete(pAVar20,0x48);
    }
  }
  Adj::~Adj(&local_60);
  RVar29.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar29.write_.shared_alloc_.alloc = (Alloc *)_Var9._M_pi;
  return (Read<signed_char>)RVar29.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Int cell_dim) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto c2dim = mesh->get_array<I8>(cell_dim, "class_dim");
  auto s2dim = mesh->get_array<I8>(cell_dim - 1, "class_dim");
  auto ncands = cands2edges.size();
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto e = cands2edges[cand];
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto c_dim = c2dim[c];
      for (Int eev_col = 0; eev_col < 2; ++eev_col) {
        if (!collapses(code, eev_col)) continue;
        auto eev_onto = 1 - eev_col;
        auto cev_onto = rot ^ eev_onto;
        auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
        auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
        auto s_opp = cs2s[c * nccs + ccs_opp];
        if (s2dim[s_opp] != c_dim) {
          code = dont_collapse(code, eev_col);
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_exposure");
  return cand_codes_w;
}